

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_object.cpp
# Opt level: O1

void __thiscall
mjs::array_object::put(array_object *this,string *name,value *val,property_attribute attr)

{
  bool bVar1;
  uint32_t uVar2;
  uint uVar3;
  uint *puVar4;
  wstring_view local_38;
  
  puVar4 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)name);
  local_38._M_len = (size_t)*puVar4;
  local_38._M_str = (wchar_t *)(puVar4 + 1);
  bVar1 = object::can_put((object *)this,&local_38);
  if ((bVar1) && (bVar1 = native_object::do_native_put(&this->super_native_object,name,val), !bVar1)
     ) {
    puVar4 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)name);
    local_38._M_len = (size_t)*puVar4;
    local_38._M_str = (wchar_t *)(puVar4 + 1);
    uVar2 = index_value_from_string(&local_38);
    if (uVar2 != 0xffffffff) {
      if ((this->super_native_object).super_object.extensible_ == false) {
        puVar4 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)name);
        local_38._M_len = (size_t)*puVar4;
        local_38._M_str = (wchar_t *)(puVar4 + 1);
        uVar3 = (*(this->super_native_object).super_object._vptr_object[6])(this);
        if (0x10 < uVar3) {
          __assert_fail("static_cast<unsigned>(a) <= static_cast<unsigned>(property_attribute::invalid)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/property_attribute.h"
                        ,0x24,"bool mjs::is_valid(property_attribute)");
        }
        if (uVar3 != 0x10) {
          return;
        }
      }
      if (this->length_ <= uVar2) {
        this->length_ = uVar2 + 1;
      }
    }
    object::put((object *)this,name,val,attr);
  }
  return;
}

Assistant:

void put(const string& name, const value& val, property_attribute attr) override {
        if (!can_put(name.view()) || do_native_put(name, val)) {
            return;
        }

        const uint32_t index = index_value_from_string(name.view());
        if (index != invalid_index_value) {
            if (!is_extensible() && is_valid(own_property_attributes(name.view()))) {
                return;
            }
            if (index >= length_) {
                length_ = index + 1;
            }
        }

        object::put(name, val, attr);
    }